

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoomDetailView.cpp
# Opt level: O2

void __thiscall RoomDetailView::display(RoomDetailView *this)

{
  bool bVar1;
  int iVar2;
  Room *this_00;
  ostream *poVar3;
  Controller *this_01;
  View *pVVar4;
  char *pcVar5;
  char *pcVar6;
  allocator aStack_41;
  string sStack_40;
  
  std::operator<<((ostream *)&std::cout,"Enter room number to get details for: \n");
  iVar2 = Input::getInt();
  this_00 = Room::findByRoomNumber(iVar2);
  if (this_00 == (Room *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Room #");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3," doesn\'t exist.\n");
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Details for room #");
    iVar2 = Room::getRoomNumber(this_00);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"\n\tStrength: ");
    iVar2 = Room::getStrength(this_00);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,"\n\tAudio: ");
    bVar1 = Room::hasVideo(this_00);
    pcVar6 = "No";
    pcVar5 = "No";
    if (bVar1) {
      pcVar5 = "Yes";
    }
    std::operator<<((ostream *)&std::cout,pcVar5);
    std::operator<<((ostream *)&std::cout,"\n\tVideo: ");
    bVar1 = Room::hasVideo(this_00);
    if (bVar1) {
      pcVar6 = "Yes";
    }
    std::operator<<((ostream *)&std::cout,pcVar6);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  this_01 = Controller::getInstance();
  std::__cxx11::string::string((string *)&sStack_40,"admin-panel",&aStack_41);
  pVVar4 = Controller::getView(this_01,&sStack_40);
  View::response->view = pVVar4;
  std::__cxx11::string::~string((string *)&sStack_40);
  return;
}

Assistant:

void RoomDetailView::display() {
    cout << "Enter room number to get details for: \n";
    int roomNumber = Input::getInt();
    Room *room = Room::findByRoomNumber(roomNumber);
    if (room) {
        cout << "Details for room #" << room->getRoomNumber() << "\n\tStrength: " << room->getStrength()
             << "\n\tAudio: ";
        if (room->hasVideo()) cout << "Yes"; else cout << "No";
        cout << "\n\tVideo: ";
        if (room->hasVideo()) cout << "Yes"; else cout << "No";
        cout << endl;
    } else {
        cout << "Room #" << roomNumber << " doesn't exist.\n";
    }
    response->view = Controller::getInstance().getView("admin-panel");
}